

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O2

void __thiscall spvtools::opt::LoopUtils::MakeLoopClosedSSA(LoopUtils *this)

{
  Function *f;
  BasicBlock *this_00;
  uint32_t uVar1;
  CFG *this_01;
  DominatorTree *pDVar2;
  DominatorTree *pDVar3;
  BasicBlock *local_108;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  exit_bb;
  LCSSARewriter lcssa_rewriter;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  merging_bb_id;
  
  CreateLoopDedicatedExits(this);
  f = this->loop_->loop_header_->function_;
  this_01 = IRContext::cfg(this->context_);
  pDVar2 = (DominatorTree *)IRContext::GetDominatorAnalysis(this->context_,f);
  exit_bb._M_h._M_buckets = &exit_bb._M_h._M_single_bucket;
  exit_bb._M_h._M_bucket_count = 1;
  exit_bb._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  exit_bb._M_h._M_element_count = 0;
  exit_bb._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  exit_bb._M_h._M_rehash_policy._M_next_resize = 0;
  exit_bb._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lcssa_rewriter.context_ = (IRContext *)&lcssa_rewriter.bb_to_defining_blocks_._M_h._M_bucket_count
  ;
  lcssa_rewriter.cfg_ = (CFG *)0x1;
  pDVar3 = (DominatorTree *)&lcssa_rewriter.dom_tree_;
  lcssa_rewriter.dom_tree_ = (DominatorTree *)0x0;
  lcssa_rewriter.exit_bb_ =
       (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
        *)0x0;
  lcssa_rewriter.merge_block_id_ = 0x3f800000;
  lcssa_rewriter.bb_to_defining_blocks_._M_h._M_buckets = (__buckets_ptr)0x0;
  lcssa_rewriter.bb_to_defining_blocks_._M_h._M_bucket_count = 0;
  Loop::GetExitBlocks(this->loop_,
                      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&lcssa_rewriter);
  while (pDVar3 = (DominatorTree *)
                  (pDVar3->roots_).
                  super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start, pDVar3 != (DominatorTree *)0x0) {
    merging_bb_id._M_h._M_buckets =
         (__buckets_ptr)
         CFG::block(this_01,*(uint32_t *)
                             &(pDVar3->roots_).
                              super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
    std::__detail::
    _Insert<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&exit_bb,(value_type *)&merging_bb_id);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&lcssa_rewriter);
  lcssa_rewriter.context_ = this->context_;
  this_00 = this->loop_->loop_merge_;
  lcssa_rewriter.cfg_ = IRContext::cfg(lcssa_rewriter.context_);
  lcssa_rewriter.dom_tree_ = pDVar2;
  lcssa_rewriter.exit_bb_ = &exit_bb;
  if (this_00 == (BasicBlock *)0x0) {
    lcssa_rewriter.merge_block_id_ = 0;
  }
  else {
    lcssa_rewriter.merge_block_id_ = BasicBlock::id(this_00);
  }
  lcssa_rewriter.bb_to_defining_blocks_._M_h._M_buckets =
       &lcssa_rewriter.bb_to_defining_blocks_._M_h._M_single_bucket;
  lcssa_rewriter.bb_to_defining_blocks_._M_h._M_bucket_count = 1;
  lcssa_rewriter.bb_to_defining_blocks_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  lcssa_rewriter.bb_to_defining_blocks_._M_h._M_element_count = 0;
  lcssa_rewriter.bb_to_defining_blocks_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  lcssa_rewriter.bb_to_defining_blocks_._M_h._M_rehash_policy._M_next_resize = 0;
  lcssa_rewriter.bb_to_defining_blocks_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  anon_unknown_15::MakeSetClosedSSA
            (this->context_,f,&this->loop_->loop_basic_blocks_,&exit_bb,&lcssa_rewriter);
  if (this->loop_->loop_merge_ != (BasicBlock *)0x0) {
    merging_bb_id._M_h._M_buckets = &merging_bb_id._M_h._M_single_bucket;
    merging_bb_id._M_h._M_bucket_count = 1;
    merging_bb_id._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    merging_bb_id._M_h._M_element_count = 0;
    merging_bb_id._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    merging_bb_id._M_h._M_rehash_policy._M_next_resize = 0;
    merging_bb_id._M_h._M_single_bucket = (__node_base_ptr)0x0;
    Loop::GetMergingBlocks
              (this->loop_,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&merging_bb_id._M_h);
    uVar1 = BasicBlock::id(this->loop_->loop_merge_);
    local_108 = (BasicBlock *)CONCAT44(local_108._4_4_,uVar1);
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&merging_bb_id._M_h,&local_108);
    std::
    _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&exit_bb._M_h);
    local_108 = this->loop_->loop_merge_;
    std::__detail::
    _Insert<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&exit_bb._M_h,&local_108);
    anon_unknown_15::MakeSetClosedSSA
              (this->context_,f,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&merging_bb_id._M_h,
               (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                *)&exit_bb._M_h,&lcssa_rewriter);
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&merging_bb_id._M_h);
  }
  IRContext::InvalidateAnalysesExceptFor
            (this->context_,kAnalysisLoopAnalysis|kAnalysisDominatorAnalysis|kAnalysisCFG);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&lcssa_rewriter.bb_to_defining_blocks_._M_h);
  std::
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&exit_bb._M_h);
  return;
}

Assistant:

void LoopUtils::MakeLoopClosedSSA() {
  CreateLoopDedicatedExits();

  Function* function = loop_->GetHeaderBlock()->GetParent();
  CFG& cfg = *context_->cfg();
  DominatorTree& dom_tree =
      context_->GetDominatorAnalysis(function)->GetDomTree();

  std::unordered_set<BasicBlock*> exit_bb;
  {
    std::unordered_set<uint32_t> exit_bb_id;
    loop_->GetExitBlocks(&exit_bb_id);
    for (uint32_t bb_id : exit_bb_id) {
      exit_bb.insert(cfg.block(bb_id));
    }
  }

  LCSSARewriter lcssa_rewriter(context_, dom_tree, exit_bb,
                               loop_->GetMergeBlock());
  MakeSetClosedSSA(context_, function, loop_->GetBlocks(), exit_bb,
                   &lcssa_rewriter);

  // Make sure all defs post-dominated by the merge block have their last use no
  // further than the merge block.
  if (loop_->GetMergeBlock()) {
    std::unordered_set<uint32_t> merging_bb_id;
    loop_->GetMergingBlocks(&merging_bb_id);
    merging_bb_id.erase(loop_->GetMergeBlock()->id());
    // Reset the exit set, now only the merge block is the exit.
    exit_bb.clear();
    exit_bb.insert(loop_->GetMergeBlock());
    // LCSSARewriter is reusable here only because it forces the creation of a
    // phi instruction in the merge block.
    MakeSetClosedSSA(context_, function, merging_bb_id, exit_bb,
                     &lcssa_rewriter);
  }

  context_->InvalidateAnalysesExceptFor(
      IRContext::Analysis::kAnalysisCFG |
      IRContext::Analysis::kAnalysisDominatorAnalysis |
      IRContext::Analysis::kAnalysisLoopAnalysis);
}